

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

void Handler_colorsetfile_ISSI_PlayerPawn
               (APlayerPawn *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  int key;
  char *text;
  bool bVar1;
  undefined1 local_68 [8];
  FPlayerColorSet color;
  int representative_color;
  char *rangefile;
  char *setname;
  int setnum;
  FPropParam *params_local;
  Baggage *bag_local;
  PClassActor *info_local;
  APlayerPawn *defaults_local;
  
  key = params[1].i;
  text = params[2].s;
  unique0x00012000 = params[3].s;
  color.Extra[4] = (ExtraRange)params[4].i;
  FPlayerColorSet::FPlayerColorSet((FPlayerColorSet *)local_68);
  FName::operator=((FName *)local_68,text);
  local_68._4_4_ = FWadCollection::CheckNumForName(&Wads,stack0xffffffffffffffc0);
  color.Name.Index._2_1_ = color.Extra[4].RangeStart;
  color.Name.Index._3_1_ = 0;
  if (key < 0) {
    FScriptPosition::Message(&bag->ScriptPosition,3,"Color set number must not be negative.\n");
  }
  else if (-1 < (int)local_68._4_4_) {
    bVar1 = DObject::IsKindOf((DObject *)info,PClassPlayerPawn::RegistrationInfo.MyClass);
    if (!bVar1) {
      __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                    ,0xa40,
                    "void Handler_colorsetfile_ISSI_PlayerPawn(APlayerPawn *, PClassActor *, Baggage &, FPropParam *)"
                   );
    }
    TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::Insert
              ((TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_> *)
               &info[1].super_PClass.super_PNativeStruct.super_PStruct.Fields,key,
               (FPlayerColorSet *)local_68);
  }
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(player, colorsetfile, ISSI, PlayerPawn)
{
	PROP_INT_PARM(setnum, 0);
	PROP_STRING_PARM(setname, 1);
	PROP_STRING_PARM(rangefile, 2);
	PROP_INT_PARM(representative_color, 3);

	FPlayerColorSet color;
	color.Name = setname;
	color.Lump = Wads.CheckNumForName(rangefile);
	color.RepresentativeColor = representative_color;
	color.NumExtraRanges = 0;

	if (setnum < 0)
	{
		bag.ScriptPosition.Message(MSG_OPTERROR, "Color set number must not be negative.\n");
	}
	else if (color.Lump >= 0)
	{
		assert(info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
		static_cast<PClassPlayerPawn *>(info)->ColorSets.Insert(setnum, color);
	}
}